

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::GeneratedMessageReflection::SetString
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field,string *value)

{
  int number;
  string *default_value;
  bool bVar1;
  CppType CVar2;
  uint32 uVar3;
  Type TVar4;
  undefined8 *puVar5;
  ArenaStringPtr *pAVar6;
  Arena *arena;
  
  if (*(Descriptor **)(field + 0x58) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString","Field does not match message type.");
  }
  if (*(int *)(field + 0x4c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_STRING) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetString",CPPTYPE_STRING);
  }
  if (field[0x50] == (FieldDescriptor)0x1) {
    uVar3 = ReflectionSchema::GetExtensionSetOffset(&this->schema_);
    number = *(int *)(field + 0x38);
    TVar4 = FieldDescriptor::type(field);
    ExtensionSet::SetString
              ((ExtensionSet *)
               ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),number,
               (FieldType)TVar4,value,field);
    return;
  }
  puVar5 = (undefined8 *)ReflectionSchema::GetFieldDefault(&this->schema_,field);
  default_value = (string *)*puVar5;
  if (*(long *)(field + 0x60) != 0) {
    bVar1 = HasOneofField(this,message,field);
    if (!bVar1) {
      ClearOneof(this,message,*(OneofDescriptor **)(field + 0x60));
      pAVar6 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
      pAVar6->ptr_ = default_value;
    }
  }
  pAVar6 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,field);
  arena = *(Arena **)
           ((long)&(message->super_MessageLite)._vptr_MessageLite +
           (ulong)(uint)(this->schema_).metadata_offset_);
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 8);
  }
  ArenaStringPtr::Set(pAVar6,default_value,value,arena);
  return;
}

Assistant:

void GeneratedMessageReflection::SetString(
    Message* message, const FieldDescriptor* field,
    const string& value) const {
  USAGE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return MutableExtensionSet(message)->SetString(field->number(),
                                                   field->type(), value, field);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        const string* default_ptr = &DefaultRaw<ArenaStringPtr>(field).Get();
        if (field->containing_oneof() && !HasOneofField(*message, field)) {
          ClearOneof(message, field->containing_oneof());
          MutableField<ArenaStringPtr>(message, field)->UnsafeSetDefault(
              default_ptr);
        }
        MutableField<ArenaStringPtr>(message, field)->Set(default_ptr,
            value, GetArena(message));
        break;
      }
    }
  }
}